

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t var_id;
  uint32_t var_id_00;
  uint32_t var_id_01;
  uint32_t var_id_02;
  uint32_t var_id_03;
  uint32_t var_id_04;
  uint32_t var_id_05;
  uint32_t var_id_06;
  uint32_t var_id_07;
  uint32_t var_id_08;
  uint32_t var_id_09;
  uint32_t var_id_10;
  uint32_t var_id_11;
  uint32_t var_id_12;
  uint32_t var_id_13;
  uint32_t var_id_14;
  uint32_t var_id_15;
  uint32_t var_id_16;
  uint32_t var_id_17;
  uint32_t var_id_18;
  uint32_t var_id_19;
  uint32_t var_id_20;
  uint32_t var_id_21;
  uint32_t var_id_22;
  uint32_t var_id_23;
  uint32_t var_id_24;
  uint32_t var_id_25;
  uint32_t var_id_26;
  uint32_t var_id_27;
  uint32_t var_id_28;
  uint32_t var_id_29;
  uint32_t var_id_30;
  uint32_t var_id_31;
  uint32_t var_id_32;
  uint32_t var_id_33;
  uint32_t var_id_34;
  uint32_t var_id_35;
  uint uVar3;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"x",(allocator<char> *)&local_30);
  nivalis::Environment::addr_of((Environment *)&(anonymous_namespace)::env,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"a",(allocator<char> *)&local_30);
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&local_50,3.0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"nan",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"nan",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random(&local_50,&local_30,var_id,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"nan\", \"nan\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x2c);
    std::operator<<(poVar2,"\n");
  }
  uVar3 = (uint)!bVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"e",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"0",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_00,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"e\", \"0\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x2d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"a*x",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"a",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_01,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"a*x\", \"a\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x2e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"a^2*x^2",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"2*a^2*x",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_02,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"a^2*x^2\", \"2*a^2*x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x2f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x^3",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"3*x^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_03,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"x^3\", \"3*x^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x30);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x^(-1)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-1/x^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_04,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"x^(-1)\", \"-1/x^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x31);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"1/x",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-x^(-2)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_05,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"1/x\", \"-x^(-2)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x32);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x/(1+x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/(1+x)^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_06,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"x/(1+x)\", \"1/(1+x)^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x33);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"log(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/x",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_07,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"log(x)\", \"1/x\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x34);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"log2(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/(x*ln(2))",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_08,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"log2(x)\", \"1/(x*ln(2))\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x35);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"log(x,a)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/(x*ln(a))",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_09,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"log(x,a)\", \"1/(x*ln(a))\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x36);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sin(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"cos(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_10,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"sin(x)\", \"cos(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x37);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cos(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-sin(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_11,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"cos(x)\", \"-sin(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x38);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tan(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/cos(x)^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_12,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"tan(x)\", \"1/cos(x)^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x39);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"arcsin(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/sqrt(1-x^2)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_13,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"arcsin(x)\", \"1/sqrt(1-x^2)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"arccos(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"-1/sqrt(1-x^2)",&local_52)
  ;
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_14,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"arccos(x)\", \"-1/sqrt(1-x^2)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"arctan(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1/(1+x^2)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_15,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"arctan(x)\", \"1/(1+x^2)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sinh(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"cosh(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_16,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"sinh(x)\", \"cosh(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cosh(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"sinh(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_17,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"cosh(x)\", \"sinh(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tanh(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1-tanh(x)^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_18,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"tanh(x)\", \"1-tanh(x)^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sin(x)*cos(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"cos(x)^2-sin(x)^2",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_19,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"sin(x)*cos(x)\", \"cos(x)^2-sin(x)^2\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x40);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sin(x)^2",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"2*sin(x)*cos(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_20,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"sin(x)^2\", \"2*sin(x)*cos(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x41);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sin(cos(x))",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-cos(cos(x))*sin(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_21,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"sin(cos(x))\", \"-cos(cos(x))*sin(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x42);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"exp(2*x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"2*exp(2*x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_22,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"exp(2*x)\", \"2*exp(2*x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x43);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"exp(abs(x))",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"exp(abs(x))*sgn(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_23,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"exp(abs(x))\", \"exp(abs(x))*sgn(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x44);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"exp2(-x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"log(2)*-1*exp2(-x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_24,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"exp2(-x)\", \"log(2)*-1*exp2(-x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x45);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"3^(-x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"ln(3)*-1*3^(-x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random(&local_50,&local_30,var_id_25,-10.0,10.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"3^(-x)\", \"ln(3)*-1*3^(-x)\", 0, -10.0, 10.0)"
                            );
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x47);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"a",(allocator<char> *)&local_30);
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&local_50,0.5);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"a^(-x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"ln(a)*-1*a^(-x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random(&local_50,&local_30,var_id_26,-10.0,10.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"a^(-x)\", \"ln(a)*-1*a^(-x)\", 0, -10.0, 10.0)"
                            );
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4a);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"abs(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"sgn(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_27,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"abs(x)\", \"sgn(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4b);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"abs(x^2)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"2*x*(x!=0)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_28,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"abs(x^2)\", \"2*x*(x!=0)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4c);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sgn(x^2)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"0",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_29,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"sgn(x^2)\", \"0\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4d);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"floor(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"0",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_30,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"floor(x)\", \"0\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4e);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"choose(x,x/2)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"0",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_31,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,"test_derivative_random(\"choose(x,x/2)\", \"0\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4f);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"gamma(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"gamma(x)*digamma(x)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_32,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"gamma(x)\", \"gamma(x)*digamma(x)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x50);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"fact(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"gamma(x+1)*digamma(x+1)",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_33,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"fact(x)\", \"gamma(x+1)*digamma(x+1)\", 0)");
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x51);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"N(x)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"-1/(sqrt(2*pi))*exp(-0.5*x^2)*x",&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random(&local_50,&local_30,var_id_34,-2.0,2.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"N(x)\", \"-1/(sqrt(2*pi))*exp(-0.5*x^2)*x\", 0, -2.0, 2.0)"
                            );
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x53);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"beta(x,x^2)",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + 2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))"
             ,&local_52);
  bVar1 = anon_unknown.dwarf_3835::test_derivative_random
                    (&local_50,&local_30,var_id_35,-100.0,100.0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    if (uVar3 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"test_diff_expr");
      std::operator<<(poVar2,": all passed\n");
      return 0;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar2 = std::operator<<(poVar2,
                             "test_derivative_random(\"beta(x,x^2)\", \"beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + \" \"2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))\", 0)"
                            );
    poVar2 = std::operator<<(poVar2,"\" (");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,")\n  at ");
    poVar2 = std::operator<<(poVar2,"test_diff_expr");
    poVar2 = std::operator<<(poVar2," line ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x56);
    std::operator<<(poVar2,"\n");
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"test_diff_expr");
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,uVar3);
  std::operator<<(poVar2," asserts FAILED\n");
  return 1;
}

Assistant:

int main() {
    BEGIN_TEST(test_diff_expr);

    env.addr_of("x", false); env.set("a", 3.0);
    ASSERT(test_derivative_random("nan", "nan", 0));
    ASSERT(test_derivative_random("e", "0", 0));
    ASSERT(test_derivative_random("a*x", "a", 0));
    ASSERT(test_derivative_random("a^2*x^2", "2*a^2*x", 0));
    ASSERT(test_derivative_random("x^3", "3*x^2", 0));
    ASSERT(test_derivative_random("x^(-1)", "-1/x^2", 0));
    ASSERT(test_derivative_random("1/x", "-x^(-2)", 0));
    ASSERT(test_derivative_random("x/(1+x)", "1/(1+x)^2", 0));
    ASSERT(test_derivative_random("log(x)", "1/x", 0));
    ASSERT(test_derivative_random("log2(x)", "1/(x*ln(2))", 0));
    ASSERT(test_derivative_random("log(x,a)", "1/(x*ln(a))", 0));
    ASSERT(test_derivative_random("sin(x)", "cos(x)", 0));
    ASSERT(test_derivative_random("cos(x)", "-sin(x)", 0));
    ASSERT(test_derivative_random("tan(x)", "1/cos(x)^2", 0));
    ASSERT(test_derivative_random("arcsin(x)", "1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arccos(x)", "-1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arctan(x)", "1/(1+x^2)", 0));
    ASSERT(test_derivative_random("sinh(x)", "cosh(x)", 0));
    ASSERT(test_derivative_random("cosh(x)", "sinh(x)", 0));
    ASSERT(test_derivative_random("tanh(x)", "1-tanh(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)*cos(x)", "cos(x)^2-sin(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)^2", "2*sin(x)*cos(x)", 0));
    ASSERT(test_derivative_random("sin(cos(x))", "-cos(cos(x))*sin(x)", 0));
    ASSERT(test_derivative_random("exp(2*x)", "2*exp(2*x)", 0));
    ASSERT(test_derivative_random("exp(abs(x))", "exp(abs(x))*sgn(x)", 0));
    ASSERT(test_derivative_random("exp2(-x)", "log(2)*-1*exp2(-x)", 0));
    ASSERT(test_derivative_random("3^(-x)", "ln(3)*-1*3^(-x)", 0,
            -10.0, 10.0));
    env.set("a", 0.5);
    ASSERT(test_derivative_random("a^(-x)", "ln(a)*-1*a^(-x)", 0,
                -10.0, 10.0));
    ASSERT(test_derivative_random("abs(x)", "sgn(x)", 0));
    ASSERT(test_derivative_random("abs(x^2)", "2*x*(x!=0)", 0));
    ASSERT(test_derivative_random("sgn(x^2)", "0", 0));
    ASSERT(test_derivative_random("floor(x)", "0", 0));
    ASSERT(test_derivative_random("choose(x,x/2)", "0", 0));
    ASSERT(test_derivative_random("gamma(x)", "gamma(x)*digamma(x)", 0));
    ASSERT(test_derivative_random("fact(x)", "gamma(x+1)*digamma(x+1)", 0));
    ASSERT(test_derivative_random("N(x)", "-1/(sqrt(2*pi))*exp(-0.5*x^2)*x", 0,
                -2.0, 2.0));
    ASSERT(test_derivative_random("beta(x,x^2)",
                "beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + "
                "2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))", 0));

    END_TEST;
}